

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestMapLite::~TestMapLite(TestMapLite *this)

{
  ~TestMapLite(this);
  operator_delete(this,600);
  return;
}

Assistant:

TestMapLite::~TestMapLite() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestMapLite)
  SharedDtor(*this);
}